

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

void * __thiscall ON_FixedSizePoolIterator::NextElement(ON_FixedSizePoolIterator *this)

{
  void *pvVar1;
  ON_FixedSizePool *pOVar2;
  void *pvVar3;
  void *pvVar4;
  
  if (this->m_it_element == (void *)0x0) {
    if (this->m_it_block == (void *)0x0) {
      pOVar2 = this->m_fsp;
      if (((pOVar2 != (ON_FixedSizePool *)0x0) &&
          (pvVar1 = pOVar2->m_first_block, pvVar1 != (void *)0x0)) &&
         (pOVar2->m_total_element_count != 0)) {
        this->m_it_block = pvVar1;
        this->m_it_element = (void *)((long)pvVar1 + 0x10);
        return (void *)((long)pvVar1 + 0x10);
      }
      this->m_it_block = (void *)0x0;
      this->m_it_element = (void *)0x0;
    }
  }
  else {
    pvVar4 = (void *)((long)this->m_it_element + this->m_fsp->m_sizeof_element);
    this->m_it_element = pvVar4;
    pvVar1 = this->m_fsp->m_al_element_array;
    if (pvVar4 != pvVar1) {
      if (pvVar4 != *(void **)((long)this->m_it_block + 8)) {
        return pvVar4;
      }
      pvVar3 = *this->m_it_block;
      this->m_it_block = pvVar3;
      pvVar4 = (void *)((long)pvVar3 + 0x10);
      if (pvVar3 == (void *)0x0) {
        pvVar4 = (void *)0x0;
      }
      this->m_it_element = pvVar4;
      if (pvVar4 != pvVar1) {
        return pvVar4;
      }
    }
    this->m_it_block = (void *)0x1;
    this->m_it_element = (void *)0x0;
  }
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePoolIterator::NextElement()
{
  if ( m_it_element )
  {
    m_it_element = (void*)(((char*)m_it_element) + m_fsp->m_sizeof_element);
    if ( m_it_element == m_fsp->m_al_element_array )
    {
      m_it_block = (void*)1; // must be non-zero
      m_it_element = 0; // terminates iteration
    }
    else if ( m_it_element == *((void**)(((char*)m_it_block) + sizeof(void*))) )
    {
      // m_it_element  = "end" pointer which means we are at the end of m_it_block
      m_it_block = *((void**)m_it_block); // m_it_block = "next" block
      m_it_element = (0 != m_it_block)    // m_it_element points to first element in m_it_block
                   ? (void*)(((char*)m_it_block)+2*sizeof(void*))
                   : 0;
      if ( m_it_element == m_fsp->m_al_element_array )
      {
        // terminate iteration (
        m_it_block = (void*)1; // must be non-zero
        m_it_element = 0; // terminates iteration
      }
    }
  }
  else if ( 0 == m_it_block )
  {
    // Start at the beginning.
    FirstElement();
  }
  return m_it_element;
}